

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O3

void __thiscall
LLVMBC::BranchInst::BranchInst
          (BranchInst *this,BasicBlock *true_block,BasicBlock *false_block,Value *cond_)

{
  Value::Value((Value *)this,(Type *)0x0,Branch);
  (this->super_Instruction).operands.
  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Instruction).operands.
  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Instruction).operands.
  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Instruction).attachments._M_h._M_buckets =
       &(this->super_Instruction).attachments._M_h._M_single_bucket;
  (this->super_Instruction).attachments._M_h._M_bucket_count = 1;
  (this->super_Instruction).attachments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_Instruction).attachments._M_h._M_element_count = 0;
  (this->super_Instruction).attachments._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_Instruction).attachments._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_Instruction).attachments._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->cond = cond_;
  (this->super_Instruction).is_terminator = true;
  this->num_blocks = 2;
  this->bbs[0] = true_block;
  this->bbs[1] = false_block;
  return;
}

Assistant:

BranchInst::BranchInst(BasicBlock *true_block, BasicBlock *false_block, Value *cond_)
    : Instruction(nullptr, ValueKind::Branch)
    , cond(cond_)
{
	set_terminator();
	num_blocks = 2;
	bbs[0] = true_block;
	bbs[1] = false_block;
}